

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O1

PAL_ERROR CorUnix::InitializeProcessCommandLine(LPWSTR lpwstrCmdLine,LPWSTR lpwstrFullPath)

{
  bool bVar1;
  errno_t eVar2;
  char16_t *pcVar3;
  size_t sVar4;
  LPWSTR _Dst;
  PAL_ERROR PVar5;
  
  if (lpwstrFullPath == (LPWSTR)0x0) {
    PVar5 = 0;
    goto LAB_001e1020;
  }
  pcVar3 = PAL_wcsrchr(lpwstrFullPath,L'/');
  *pcVar3 = L'\0';
  sVar4 = PAL_wcslen(lpwstrFullPath);
  _Dst = (LPWSTR)InternalMalloc(sVar4 * 2 + 2);
  if (_Dst == (LPWSTR)0x0) {
    if (PAL_InitializeChakraCoreCalled == false) {
LAB_001e1044:
      abort();
    }
    PVar5 = 8;
LAB_001e0ffa:
    bVar1 = false;
  }
  else {
    eVar2 = wcscpy_s((char16_t_conflict *)_Dst,sVar4 + 1,(char16_t_conflict *)lpwstrFullPath);
    if (eVar2 != 0) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_001e1044;
      free(_Dst);
      PVar5 = 0x54f;
      goto LAB_001e0ffa;
    }
    *pcVar3 = L'/';
    free(g_lpwstrAppDir);
    bVar1 = true;
    PVar5 = 0;
    g_lpwstrAppDir = _Dst;
  }
  if (!bVar1) {
    return PVar5;
  }
LAB_001e1020:
  free(g_lpwstrCmdLine);
  g_lpwstrCmdLine = lpwstrCmdLine;
  return PVar5;
}

Assistant:

PAL_ERROR
CorUnix::InitializeProcessCommandLine(
    LPWSTR lpwstrCmdLine,
    LPWSTR lpwstrFullPath
)
{
    PAL_ERROR palError = NO_ERROR;
    LPWSTR initial_dir = NULL;

    //
    // Save the command line and initial directory
    //

    if (lpwstrFullPath)
    {
        LPWSTR lpwstr = PAL_wcsrchr(lpwstrFullPath, '/');
        lpwstr[0] = '\0';
        size_t n = PAL_wcslen(lpwstrFullPath) + 1;

        size_t iLen = n;
        initial_dir = reinterpret_cast<LPWSTR>(InternalMalloc(iLen*sizeof(WCHAR)));
        if (NULL == initial_dir)
        {
            ERROR("malloc() failed! (initial_dir) \n");
            palError = ERROR_NOT_ENOUGH_MEMORY;
            goto exit;
        }

        if (wcscpy_s(initial_dir, iLen, lpwstrFullPath) != SAFECRT_SUCCESS)
        {
            ERROR("wcscpy_s failed!\n");
            free(initial_dir);
            palError = ERROR_INTERNAL_ERROR;
            goto exit;
        }

        lpwstr[0] = '/';

        free(g_lpwstrAppDir);
        g_lpwstrAppDir = initial_dir;
    }

    free(g_lpwstrCmdLine);
    g_lpwstrCmdLine = lpwstrCmdLine;

exit:
    return palError;
}